

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O0

void __thiscall capnp::EzRpcClient::Impl::Impl(Impl *this,int socketFd,ReaderOptions readerOpts)

{
  EzRpcContext *this_00;
  LowLevelAsyncIoProvider *pLVar1;
  Own<kj::AsyncIoStream> local_70;
  Own<capnp::EzRpcClient::Impl::ClientContext> local_60 [2];
  Promise<void> local_38;
  uint local_24;
  Impl *pIStack_20;
  int socketFd_local;
  Impl *this_local;
  ReaderOptions readerOpts_local;
  
  this_local = (Impl *)readerOpts.traversalLimitInWords;
  readerOpts_local.traversalLimitInWords._0_4_ = readerOpts.nestingLimit;
  local_24 = socketFd;
  pIStack_20 = this;
  EzRpcContext::getThreadLocal();
  kj::Promise<void>::Promise(&local_38);
  kj::Promise<void>::fork((Promise<void> *)&this->setupPromise);
  kj::Promise<void>::~Promise(&local_38);
  this_00 = kj::Own<capnp::EzRpcContext>::operator->(&this->context);
  pLVar1 = EzRpcContext::getLowLevelIoProvider(this_00);
  (*pLVar1->_vptr_LowLevelAsyncIoProvider[2])(&local_70,pLVar1,(ulong)local_24,0);
  kj::heap<capnp::EzRpcClient::Impl::ClientContext,kj::Own<kj::AsyncIoStream>,capnp::ReaderOptions&>
            ((kj *)local_60,&local_70,(ReaderOptions *)&this_local);
  kj::Maybe<kj::Own<capnp::EzRpcClient::Impl::ClientContext>_>::Maybe(&this->clientContext,local_60)
  ;
  kj::Own<capnp::EzRpcClient::Impl::ClientContext>::~Own(local_60);
  kj::Own<kj::AsyncIoStream>::~Own(&local_70);
  return;
}

Assistant:

Impl(int socketFd, ReaderOptions readerOpts)
      : context(EzRpcContext::getThreadLocal()),
        setupPromise(kj::Promise<void>(kj::READY_NOW).fork()),
        clientContext(kj::heap<ClientContext>(
            context->getLowLevelIoProvider().wrapSocketFd(socketFd),
            readerOpts)) {}